

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall Assimp::ColladaExporter::WriteHeader(ColladaExporter *this)

{
  aiNode *paVar1;
  uint *puVar2;
  byte bVar3;
  bool bVar4;
  char *pcVar5;
  int iVar6;
  tm *__tp;
  aiNode *this_00;
  aiNode **ppaVar7;
  ostream *poVar8;
  ulong uVar9;
  ostream *poVar10;
  long lVar11;
  long lVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  aiScene *paVar14;
  undefined8 in_R8;
  undefined8 uVar15;
  ulong uVar16;
  size_t sVar17;
  ColladaExporter *pCVar18;
  char *pcVar19;
  aiMetadata *paVar20;
  _Alloc_hider _Var21;
  byte bVar22;
  bool bVar23;
  bool bVar24;
  float fVar25;
  string up_axis;
  char date_str [20];
  time_t date;
  aiString value;
  string local_908;
  ColladaExporter *local_8e8;
  aiMetadata *local_8e0;
  char *local_8d8;
  ulong local_8d0;
  ostream *local_8c8;
  float local_8bc;
  aiQuaterniont<float> local_8b8;
  long *local_8a8;
  char *local_8a0;
  long local_898 [2];
  aiVector3t<float> local_888;
  aiVector3t<float> local_878;
  char local_868 [32];
  time_t local_848;
  string local_840 [32];
  undefined8 local_438;
  
  if (WriteHeader()::epsilon == '\0') {
    WriteHeader();
  }
  if (WriteHeader()::x_rot == '\0') {
    WriteHeader();
  }
  if (WriteHeader()::y_rot == '\0') {
    WriteHeader();
  }
  if (WriteHeader()::z_rot == '\0') {
    WriteHeader();
  }
  local_848 = time((time_t *)0x0);
  __tp = localtime(&local_848);
  strftime(local_868,0x14,"%Y-%m-%dT%H:%M:%S",__tp);
  local_878.x = 0.0;
  local_878.y = 0.0;
  local_878.z = 0.0;
  local_8b8.w = 1.0;
  local_8b8.x = 0.0;
  local_8b8.y = 0.0;
  local_8b8.z = 0.0;
  local_888.x = 0.0;
  local_888.y = 0.0;
  local_888.z = 0.0;
  aiMatrix4x4t<float>::Decompose
            (&this->mScene->mRootNode->mTransformation,&local_878,&local_8b8,&local_888);
  fVar25 = SQRT(local_8b8.w * local_8b8.w +
                local_8b8.z * local_8b8.z + local_8b8.x * local_8b8.x + local_8b8.y * local_8b8.y);
  if ((fVar25 != 0.0) || (NAN(fVar25))) {
    fVar25 = 1.0 / fVar25;
    local_8b8.w = local_8b8.w * fVar25;
    local_8b8.x = local_8b8.x * fVar25;
    local_8b8.y = local_8b8.y * fVar25;
    local_8b8.z = local_8b8.z * fVar25;
  }
  local_8bc = 1.0;
  bVar22 = 1;
  if (((ABS(local_878.x - local_878.y) <= WriteHeader::epsilon) &&
      (ABS(local_878.x - local_878.z) <= WriteHeader::epsilon)) &&
     (ABS(local_878.y - local_878.z) <= WriteHeader::epsilon)) {
    local_8bc = (local_878.z + local_878.y + local_878.x) / 3.0;
    bVar22 = 0;
  }
  local_8a8 = local_898;
  pcVar19 = "Y_UP";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"Y_UP","");
  if (((WriteHeader::epsilon < ABS(local_8b8.x - WriteHeader::x_rot.x)) ||
      (WriteHeader::epsilon < ABS(local_8b8.y - WriteHeader::x_rot.y))) ||
     ((WriteHeader::epsilon < ABS(local_8b8.z - WriteHeader::x_rot.z) ||
      (WriteHeader::epsilon < ABS(local_8b8.w - WriteHeader::x_rot.w))))) {
    if (((ABS(local_8b8.x - WriteHeader::y_rot.x) <= WriteHeader::epsilon) &&
        (ABS(local_8b8.y - WriteHeader::y_rot.y) <= WriteHeader::epsilon)) &&
       ((ABS(local_8b8.z - WriteHeader::y_rot.z) <= WriteHeader::epsilon &&
        (ABS(local_8b8.w - WriteHeader::y_rot.w) <= WriteHeader::epsilon)))) goto LAB_0030bdda;
    bVar3 = 1;
    if ((((ABS(local_8b8.x - WriteHeader::z_rot.x) <= WriteHeader::epsilon) &&
         (ABS(local_8b8.y - WriteHeader::z_rot.y) <= WriteHeader::epsilon)) &&
        (ABS(local_8b8.z - WriteHeader::z_rot.z) <= WriteHeader::epsilon)) &&
       (ABS(local_8b8.w - WriteHeader::z_rot.w) <= WriteHeader::epsilon)) {
      pcVar19 = "Z_UP";
      goto LAB_0030bdda;
    }
  }
  else {
    pcVar19 = "X_UP";
LAB_0030bdda:
    in_R8 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_8a8,0,local_8a0,(ulong)pcVar19);
    bVar3 = bVar22;
  }
  if (((1e-06 < ABS(local_888.x)) || (1e-06 < ABS(local_888.y))) || (1e-06 < ABS(local_888.z))) {
    paVar14 = this->mScene;
LAB_0030be48:
    SceneCombiner::CopyScene((aiScene **)&local_438,paVar14,true);
    this_00 = (aiNode *)operator_new(0x478);
    local_840[0]._M_dataplus._M_p = (pointer)&local_840[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"Scene","");
    aiNode::aiNode(this_00,local_840);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
      operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1);
    }
    this_00->mNumChildren = 1;
    ppaVar7 = (aiNode **)operator_new__(8);
    this_00->mChildren = ppaVar7;
    paVar14 = (aiScene *)CONCAT44(local_438._4_4_,(uint)local_438);
    paVar1 = paVar14->mRootNode;
    *ppaVar7 = paVar1;
    paVar1->mParent = this_00;
    paVar14->mRootNode = this_00;
    this->mScene = paVar14;
    this->mSceneOwned = true;
    in_R8 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_8a8,0,local_8a0,0x6aaf80);
    local_8bc = 1.0;
  }
  else {
    paVar14 = this->mScene;
    if (!(bool)(paVar14->mRootNode->mNumChildren != 0 & (bVar3 ^ 1))) goto LAB_0030be48;
  }
  poVar10 = (ostream *)&this->field_0x38;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar10,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<asset>",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)&this->startstr);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar10,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<contributor>",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)&this->startstr);
  paVar20 = this->mScene->mMetaData;
  local_8e8 = this;
  local_8c8 = poVar10;
  if (paVar20 == (aiMetadata *)0x0) {
    paVar20 = this->mScene->mRootNode->mMetaData;
    local_8d8 = (char *)((long)&local_438 + 4);
    local_438._0_4_ = 0;
    local_438._4_4_ = (uint)local_438._5_3_ << 8;
    memset((void *)((long)&local_438 + 5),0x1b,0x3ff);
    if (paVar20 != (aiMetadata *)0x0) goto LAB_0030c066;
    bVar4 = true;
    paVar20 = (aiMetadata *)0x0;
LAB_0030c20e:
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar10,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<author>",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Assimp",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</author>",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    bVar23 = true;
    if (!bVar4) goto LAB_0030c383;
LAB_0030c503:
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar10,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<authoring_tool>",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Assimp Exporter",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</authoring_tool>",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    bVar4 = true;
    if (!bVar23) goto LAB_0030c664;
  }
  else {
    local_8d8 = (char *)((long)&local_438 + 4);
    local_438._0_4_ = 0;
    local_438._4_4_ = (uint)local_438._5_3_ << 8;
    memset((void *)((long)&local_438 + 5),0x1b,0x3ff);
LAB_0030c066:
    local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"Author","");
    _Var21._M_p = local_908._M_dataplus._M_p;
    sVar17 = 0x3ff;
    if ((local_908._M_string_length & 0xfffffc00) == 0) {
      sVar17 = local_908._M_string_length & 0xffffffff;
    }
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_908._M_dataplus._M_p,sVar17);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar17 + 4) = 0;
    uVar9 = (ulong)paVar20->mNumProperties;
    local_8e0 = paVar20;
    if (uVar9 == 0) {
      bVar4 = true;
      this = local_8e8;
    }
    else {
      lVar11 = uVar9 << 4;
      pcVar19 = paVar20->mKeys->data;
      uVar16 = 1;
      lVar12 = 0;
      local_8d0 = uVar9;
      bVar4 = true;
      do {
        if ((((aiString *)(pcVar19 + -4))->length == (ai_uint32)sVar17) &&
           (iVar6 = bcmp(pcVar19,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),sVar17),
           this = local_8e8, uVar9 = local_8d0, iVar6 == 0)) {
          if (*(int *)((long)&local_8e0->mValues->mType + lVar12) == 5) {
            puVar2 = *(uint **)((long)&local_8e0->mValues->mData + lVar12);
            bVar23 = true;
            if (puVar2 != (uint *)&local_438) {
              local_438._0_4_ = *puVar2;
              uVar9 = (ulong)(uint)local_438;
              memcpy(local_8d8,puVar2 + 1,uVar9);
              *(undefined1 *)((long)&local_438 + uVar9 + 4) = 0;
            }
          }
          else {
            bVar23 = false;
          }
          goto LAB_0030c1d7;
        }
        bVar23 = uVar16 < uVar9;
        lVar12 = lVar12 + 0x10;
        uVar16 = uVar16 + 1;
        pcVar19 = pcVar19 + 0x404;
        bVar4 = bVar23;
      } while (lVar11 != lVar12);
      bVar4 = false;
      this = local_8e8;
LAB_0030c1d7:
      bVar4 = (bool)(bVar4 & bVar23 ^ 1);
      poVar10 = local_8c8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var21._M_p != &local_908.field_2) {
      operator_delete(_Var21._M_p,local_908.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      bVar4 = false;
      paVar20 = local_8e0;
      goto LAB_0030c20e;
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar10,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length)
    ;
    paVar20 = local_8e0;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<author>",8);
    pcVar19 = local_8d8;
    local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
    sVar17 = strlen(local_8d8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_908,pcVar19,(long)&local_438 + sVar17 + 4);
    XMLEscape(local_840,&local_908);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</author>",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
      operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_908._M_dataplus._M_p != &local_908.field_2) {
      operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
    }
LAB_0030c383:
    local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"SourceAsset_Generator","")
    ;
    _Var21._M_p = local_908._M_dataplus._M_p;
    sVar17 = 0x3ff;
    if ((local_908._M_string_length & 0xfffffc00) == 0) {
      sVar17 = local_908._M_string_length & 0xffffffff;
    }
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_908._M_dataplus._M_p,sVar17);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar17 + 4) = 0;
    uVar9 = (ulong)paVar20->mNumProperties;
    local_8e0 = paVar20;
    if (uVar9 == 0) {
      bVar4 = true;
      this = local_8e8;
    }
    else {
      lVar11 = uVar9 << 4;
      pcVar19 = paVar20->mKeys->data;
      uVar16 = 1;
      lVar12 = 0;
      local_8d0 = uVar9;
      bVar4 = true;
      do {
        if ((((aiString *)(pcVar19 + -4))->length == (ai_uint32)sVar17) &&
           (iVar6 = bcmp(pcVar19,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),sVar17),
           pcVar5 = local_8d8, this = local_8e8, uVar9 = local_8d0, iVar6 == 0)) {
          if (*(int *)((long)&local_8e0->mValues->mType + lVar12) == 5) {
            puVar2 = *(uint **)((long)&local_8e0->mValues->mData + lVar12);
            bVar23 = true;
            if (puVar2 != (uint *)&local_438) {
              local_438._0_4_ = *puVar2;
              uVar9 = (ulong)(uint)local_438;
              memcpy(local_8d8,puVar2 + 1,uVar9);
              pcVar5[uVar9] = '\0';
              _Var21._M_p = local_908._M_dataplus._M_p;
            }
          }
          else {
            bVar23 = false;
          }
          goto LAB_0030c4d0;
        }
        bVar23 = uVar16 < uVar9;
        lVar12 = lVar12 + 0x10;
        uVar16 = uVar16 + 1;
        pcVar19 = pcVar19 + 0x404;
        bVar4 = bVar23;
      } while (lVar11 != lVar12);
      bVar4 = false;
      this = local_8e8;
LAB_0030c4d0:
      bVar4 = (bool)(bVar4 & bVar23 ^ 1);
      poVar10 = local_8c8;
    }
    paVar13 = &local_908.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var21._M_p != paVar13) {
      operator_delete(_Var21._M_p,local_908.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      bVar23 = false;
      paVar20 = local_8e0;
      goto LAB_0030c503;
    }
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length
                        );
    paVar20 = local_8e0;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"<authoring_tool>",0x10);
    pcVar19 = local_8d8;
    local_908._M_dataplus._M_p = (pointer)paVar13;
    sVar17 = strlen(local_8d8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,pcVar19,pcVar19 + sVar17);
    XMLEscape(local_840,&local_908);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</authoring_tool>",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
      operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_908._M_dataplus._M_p != paVar13) {
      operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
    }
LAB_0030c664:
    local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"Comments","");
    _Var21._M_p = local_908._M_dataplus._M_p;
    sVar17 = 0x3ff;
    if ((local_908._M_string_length & 0xfffffc00) == 0) {
      sVar17 = local_908._M_string_length & 0xffffffff;
    }
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_908._M_dataplus._M_p,sVar17);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar17 + 4) = 0;
    uVar9 = (ulong)paVar20->mNumProperties;
    local_8e0 = paVar20;
    if (uVar9 == 0) {
      bVar22 = 0;
      pCVar18 = local_8e8;
    }
    else {
      pcVar19 = paVar20->mKeys->data;
      in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
      uVar16 = 1;
      lVar11 = 0;
      do {
        if (((aiString *)(pcVar19 + -4))->length == (ai_uint32)sVar17) {
          local_8d0 = CONCAT44(local_8d0._4_4_,(int)in_R8);
          iVar6 = bcmp(pcVar19,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),sVar17);
          pcVar5 = local_8d8;
          pCVar18 = local_8e8;
          bVar22 = (byte)local_8d0;
          if (iVar6 == 0) {
            if (*(int *)((long)&local_8e0->mValues->mType + lVar11) == 5) {
              puVar2 = *(uint **)((long)&local_8e0->mValues->mData + lVar11);
              sVar17 = 1;
              if (puVar2 != (uint *)&local_438) {
                local_438._0_4_ = *puVar2;
                uVar9 = (ulong)(uint)local_438;
                memcpy(local_8d8,puVar2 + 1,uVar9);
                pcVar5[uVar9] = '\0';
              }
            }
            else {
              sVar17 = 0;
            }
            goto LAB_0030c79e;
          }
        }
        in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),uVar16 < uVar9);
        lVar11 = lVar11 + 0x10;
        uVar16 = uVar16 + 1;
        pcVar19 = pcVar19 + 0x404;
      } while (uVar9 << 4 != lVar11);
      bVar22 = 0;
      pCVar18 = local_8e8;
    }
LAB_0030c79e:
    paVar13 = &local_908.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var21._M_p != paVar13) {
      operator_delete(_Var21._M_p,local_908.field_2._M_allocated_capacity + 1);
    }
    paVar20 = local_8e0;
    if ((bVar22 & (byte)sVar17 & 1) != 0) {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_8c8,(pCVar18->startstr)._M_dataplus._M_p,
                           (pCVar18->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"<comments>",10);
      pcVar19 = local_8d8;
      local_908._M_dataplus._M_p = (pointer)paVar13;
      sVar17 = strlen(local_8d8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,pcVar19,pcVar19 + sVar17)
      ;
      XMLEscape(local_840,&local_908);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</comments>",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,(pCVar18->endstr)._M_dataplus._M_p,(pCVar18->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != paVar13) {
        operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
      }
    }
    local_908._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"SourceAsset_Copyright","")
    ;
    _Var21._M_p = local_908._M_dataplus._M_p;
    sVar17 = 0x3ff;
    if ((local_908._M_string_length & 0xfffffc00) == 0) {
      sVar17 = local_908._M_string_length & 0xffffffff;
    }
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_908._M_dataplus._M_p,sVar17);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar17 + 4) = 0;
    uVar9 = (ulong)paVar20->mNumProperties;
    if (uVar9 == 0) {
      bVar22 = 0;
      pCVar18 = local_8e8;
    }
    else {
      pcVar19 = paVar20->mKeys->data;
      in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
      uVar16 = 1;
      lVar11 = 0;
      do {
        if (((aiString *)(pcVar19 + -4))->length == (ai_uint32)sVar17) {
          local_8d0 = CONCAT44(local_8d0._4_4_,(int)in_R8);
          iVar6 = bcmp(pcVar19,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),sVar17);
          pcVar5 = local_8d8;
          pCVar18 = local_8e8;
          bVar22 = (byte)local_8d0;
          if (iVar6 == 0) {
            if (*(int *)((long)&local_8e0->mValues->mType + lVar11) == 5) {
              puVar2 = *(uint **)((long)&local_8e0->mValues->mData + lVar11);
              sVar17 = 1;
              if (puVar2 != (uint *)&local_438) {
                local_438._0_4_ = *puVar2;
                uVar9 = (ulong)(uint)local_438;
                memcpy(local_8d8,puVar2 + 1,uVar9);
                pcVar5[uVar9] = '\0';
              }
            }
            else {
              sVar17 = 0;
            }
            goto LAB_0030c9d6;
          }
        }
        in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),uVar16 < uVar9);
        lVar11 = lVar11 + 0x10;
        uVar16 = uVar16 + 1;
        pcVar19 = pcVar19 + 0x404;
      } while (uVar9 << 4 != lVar11);
      bVar22 = 0;
      pCVar18 = local_8e8;
    }
LAB_0030c9d6:
    paVar13 = &local_908.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var21._M_p != paVar13) {
      operator_delete(_Var21._M_p,local_908.field_2._M_allocated_capacity + 1);
    }
    paVar20 = local_8e0;
    if ((bVar22 & (byte)sVar17 & 1) != 0) {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_8c8,(pCVar18->startstr)._M_dataplus._M_p,
                           (pCVar18->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"<copyright>",0xb);
      pcVar19 = local_8d8;
      local_908._M_dataplus._M_p = (pointer)paVar13;
      sVar17 = strlen(local_8d8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,pcVar19,pcVar19 + sVar17)
      ;
      XMLEscape(local_840,&local_908);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</copyright>",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,(pCVar18->endstr)._M_dataplus._M_p,(pCVar18->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != paVar13) {
        operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
      }
    }
    local_908._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"SourceData","");
    _Var21._M_p = local_908._M_dataplus._M_p;
    sVar17 = 0x3ff;
    if ((local_908._M_string_length & 0xfffffc00) == 0) {
      sVar17 = local_908._M_string_length & 0xffffffff;
    }
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_908._M_dataplus._M_p,sVar17);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar17 + 4) = 0;
    uVar9 = (ulong)paVar20->mNumProperties;
    if (uVar9 == 0) {
      bVar22 = 0;
      this = local_8e8;
    }
    else {
      pcVar19 = paVar20->mKeys->data;
      in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
      uVar16 = 1;
      lVar11 = 0;
      do {
        if (((aiString *)(pcVar19 + -4))->length == (ai_uint32)sVar17) {
          local_8d0 = CONCAT44(local_8d0._4_4_,(int)in_R8);
          iVar6 = bcmp(pcVar19,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),sVar17);
          pcVar5 = local_8d8;
          this = local_8e8;
          bVar22 = (byte)local_8d0;
          if (iVar6 == 0) {
            if (*(int *)((long)&local_8e0->mValues->mType + lVar11) == 5) {
              puVar2 = *(uint **)((long)&local_8e0->mValues->mData + lVar11);
              sVar17 = 1;
              if (puVar2 != (uint *)&local_438) {
                local_438._0_4_ = *puVar2;
                uVar9 = (ulong)(uint)local_438;
                memcpy(local_8d8,puVar2 + 1,uVar9);
                pcVar5[uVar9] = '\0';
              }
            }
            else {
              sVar17 = 0;
            }
            goto LAB_0030cc0e;
          }
        }
        in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),uVar16 < uVar9);
        lVar11 = lVar11 + 0x10;
        uVar16 = uVar16 + 1;
        pcVar19 = pcVar19 + 0x404;
      } while (uVar9 << 4 != lVar11);
      bVar22 = 0;
      this = local_8e8;
    }
LAB_0030cc0e:
    paVar13 = &local_908.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var21._M_p != paVar13) {
      operator_delete(_Var21._M_p,local_908.field_2._M_allocated_capacity + 1);
    }
    poVar10 = local_8c8;
    if ((bVar22 & (byte)sVar17 & 1) == 0) {
      bVar4 = false;
      paVar20 = local_8e0;
    }
    else {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_8c8,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<source_data>",0xd);
      pcVar19 = local_8d8;
      local_908._M_dataplus._M_p = (pointer)paVar13;
      sVar17 = strlen(local_8d8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,pcVar19,pcVar19 + sVar17)
      ;
      XMLEscape(local_840,&local_908);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      paVar20 = local_8e0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</source_data>",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != paVar13) {
        operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
      }
      bVar4 = false;
    }
  }
  PopTag(this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar10,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</contributor>",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  local_8e0 = paVar20;
  if (!bVar4) {
    local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"Created","");
    _Var21._M_p = local_908._M_dataplus._M_p;
    sVar17 = 0x3ff;
    if ((local_908._M_string_length & 0xfffffc00) == 0) {
      sVar17 = local_908._M_string_length & 0xffffffff;
    }
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_908._M_dataplus._M_p,sVar17);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar17 + 4) = 0;
    uVar9 = (ulong)paVar20->mNumProperties;
    if (uVar9 == 0) {
      bVar23 = true;
    }
    else {
      lVar11 = uVar9 << 4;
      pcVar19 = paVar20->mKeys->data;
      uVar16 = 1;
      lVar12 = 0;
      local_8d0 = uVar9;
      bVar23 = true;
      do {
        if ((((aiString *)(pcVar19 + -4))->length == (ai_uint32)sVar17) &&
           (iVar6 = bcmp(pcVar19,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),sVar17),
           pcVar5 = local_8d8, uVar9 = local_8d0, iVar6 == 0)) {
          if (*(int *)((long)&local_8e0->mValues->mType + lVar12) == 5) {
            puVar2 = *(uint **)((long)&local_8e0->mValues->mData + lVar12);
            bVar24 = true;
            if (puVar2 != (uint *)&local_438) {
              local_438._0_4_ = *puVar2;
              uVar9 = (ulong)(uint)local_438;
              memcpy(local_8d8,puVar2 + 1,uVar9);
              pcVar5[uVar9] = '\0';
            }
          }
          else {
            bVar24 = false;
          }
          goto LAB_0030ceb0;
        }
        bVar24 = uVar16 < uVar9;
        lVar12 = lVar12 + 0x10;
        uVar16 = uVar16 + 1;
        pcVar19 = pcVar19 + 0x404;
        bVar23 = bVar24;
      } while (lVar11 != lVar12);
      bVar23 = false;
LAB_0030ceb0:
      bVar23 = (bool)(bVar23 & bVar24 ^ 1);
      poVar10 = local_8c8;
      this = local_8e8;
      _Var21._M_p = local_908._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var21._M_p != &local_908.field_2) {
      operator_delete(_Var21._M_p,local_908.field_2._M_allocated_capacity + 1);
    }
    if (!bVar23) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar10,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<created>",9);
      pcVar19 = local_8d8;
      local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
      sVar17 = strlen(local_8d8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,pcVar19,pcVar19 + sVar17)
      ;
      XMLEscape(local_840,&local_908);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      paVar20 = local_8e0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</created>",10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != &local_908.field_2) {
        operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0030cf5f;
    }
  }
  paVar20 = local_8e0;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar10,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<created>",9);
  sVar17 = strlen(local_868);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_868,sVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</created>",10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
LAB_0030cf5f:
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar10,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<modified>",10);
  sVar17 = strlen(local_868);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_868,sVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</modified>",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  if (!bVar4) {
    local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"Keywords","");
    _Var21._M_p = local_908._M_dataplus._M_p;
    sVar17 = 0x3ff;
    if ((local_908._M_string_length & 0xfffffc00) == 0) {
      sVar17 = local_908._M_string_length & 0xffffffff;
    }
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_908._M_dataplus._M_p,sVar17);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar17 + 4) = 0;
    uVar9 = (ulong)paVar20->mNumProperties;
    if (uVar9 == 0) {
      bVar22 = 0;
      pCVar18 = local_8e8;
    }
    else {
      pcVar19 = paVar20->mKeys->data;
      in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
      uVar16 = 1;
      lVar11 = 0;
      do {
        if (((aiString *)(pcVar19 + -4))->length == (ai_uint32)sVar17) {
          local_8d0 = CONCAT44(local_8d0._4_4_,(int)in_R8);
          iVar6 = bcmp(pcVar19,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),sVar17);
          pcVar5 = local_8d8;
          pCVar18 = local_8e8;
          bVar22 = (byte)local_8d0;
          if (iVar6 == 0) {
            if (*(int *)((long)&local_8e0->mValues->mType + lVar11) == 5) {
              puVar2 = *(uint **)((long)&local_8e0->mValues->mData + lVar11);
              sVar17 = 1;
              if (puVar2 != (uint *)&local_438) {
                local_438._0_4_ = *puVar2;
                uVar9 = (ulong)(uint)local_438;
                memcpy(local_8d8,puVar2 + 1,uVar9);
                pcVar5[uVar9] = '\0';
              }
            }
            else {
              sVar17 = 0;
            }
            goto LAB_0030d215;
          }
        }
        in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),uVar16 < uVar9);
        lVar11 = lVar11 + 0x10;
        uVar16 = uVar16 + 1;
        pcVar19 = pcVar19 + 0x404;
      } while (uVar9 << 4 != lVar11);
      bVar22 = 0;
      pCVar18 = local_8e8;
    }
LAB_0030d215:
    paVar13 = &local_908.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var21._M_p != paVar13) {
      operator_delete(_Var21._M_p,local_908.field_2._M_allocated_capacity + 1);
    }
    paVar20 = local_8e0;
    if ((bVar22 & (byte)sVar17 & 1) != 0) {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_8c8,(pCVar18->startstr)._M_dataplus._M_p,
                           (pCVar18->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"<keywords>",10);
      pcVar19 = local_8d8;
      local_908._M_dataplus._M_p = (pointer)paVar13;
      sVar17 = strlen(local_8d8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,pcVar19,pcVar19 + sVar17)
      ;
      XMLEscape(local_840,&local_908);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</keywords>",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,(pCVar18->endstr)._M_dataplus._M_p,(pCVar18->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != paVar13) {
        operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
      }
    }
    local_908._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"Revision","");
    _Var21._M_p = local_908._M_dataplus._M_p;
    sVar17 = 0x3ff;
    if ((local_908._M_string_length & 0xfffffc00) == 0) {
      sVar17 = local_908._M_string_length & 0xffffffff;
    }
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_908._M_dataplus._M_p,sVar17);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar17 + 4) = 0;
    uVar9 = (ulong)paVar20->mNumProperties;
    if (uVar9 == 0) {
      bVar22 = 0;
      pCVar18 = local_8e8;
    }
    else {
      pcVar19 = paVar20->mKeys->data;
      in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
      uVar16 = 1;
      lVar11 = 0;
      do {
        if (((aiString *)(pcVar19 + -4))->length == (ai_uint32)sVar17) {
          local_8d0 = CONCAT44(local_8d0._4_4_,(int)in_R8);
          iVar6 = bcmp(pcVar19,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),sVar17);
          pcVar5 = local_8d8;
          pCVar18 = local_8e8;
          bVar22 = (byte)local_8d0;
          if (iVar6 == 0) {
            if (*(int *)((long)&local_8e0->mValues->mType + lVar11) == 5) {
              puVar2 = *(uint **)((long)&local_8e0->mValues->mData + lVar11);
              sVar17 = 1;
              if (puVar2 != (uint *)&local_438) {
                local_438._0_4_ = *puVar2;
                uVar9 = (ulong)(uint)local_438;
                memcpy(local_8d8,puVar2 + 1,uVar9);
                pcVar5[uVar9] = '\0';
              }
            }
            else {
              sVar17 = 0;
            }
            goto LAB_0030d44d;
          }
        }
        in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),uVar16 < uVar9);
        lVar11 = lVar11 + 0x10;
        uVar16 = uVar16 + 1;
        pcVar19 = pcVar19 + 0x404;
      } while (uVar9 << 4 != lVar11);
      bVar22 = 0;
      pCVar18 = local_8e8;
    }
LAB_0030d44d:
    paVar13 = &local_908.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var21._M_p != paVar13) {
      operator_delete(_Var21._M_p,local_908.field_2._M_allocated_capacity + 1);
    }
    paVar20 = local_8e0;
    if ((bVar22 & (byte)sVar17 & 1) != 0) {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_8c8,(pCVar18->startstr)._M_dataplus._M_p,
                           (pCVar18->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"<revision>",10);
      pcVar19 = local_8d8;
      local_908._M_dataplus._M_p = (pointer)paVar13;
      sVar17 = strlen(local_8d8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,pcVar19,pcVar19 + sVar17)
      ;
      XMLEscape(local_840,&local_908);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</revision>",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,(pCVar18->endstr)._M_dataplus._M_p,(pCVar18->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != paVar13) {
        operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
      }
    }
    local_908._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"Subject","");
    _Var21._M_p = local_908._M_dataplus._M_p;
    sVar17 = 0x3ff;
    if ((local_908._M_string_length & 0xfffffc00) == 0) {
      sVar17 = local_908._M_string_length & 0xffffffff;
    }
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_908._M_dataplus._M_p,sVar17);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar17 + 4) = 0;
    uVar9 = (ulong)paVar20->mNumProperties;
    if (uVar9 == 0) {
      bVar22 = 0;
      pCVar18 = local_8e8;
    }
    else {
      pcVar19 = paVar20->mKeys->data;
      in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
      uVar16 = 1;
      lVar11 = 0;
      do {
        if (((aiString *)(pcVar19 + -4))->length == (ai_uint32)sVar17) {
          local_8d0 = CONCAT44(local_8d0._4_4_,(int)in_R8);
          iVar6 = bcmp(pcVar19,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),sVar17);
          pcVar5 = local_8d8;
          pCVar18 = local_8e8;
          bVar22 = (byte)local_8d0;
          if (iVar6 == 0) {
            if (*(int *)((long)&local_8e0->mValues->mType + lVar11) == 5) {
              puVar2 = *(uint **)((long)&local_8e0->mValues->mData + lVar11);
              sVar17 = 1;
              if (puVar2 != (uint *)&local_438) {
                local_438._0_4_ = *puVar2;
                uVar9 = (ulong)(uint)local_438;
                memcpy(local_8d8,puVar2 + 1,uVar9);
                pcVar5[uVar9] = '\0';
              }
            }
            else {
              sVar17 = 0;
            }
            goto LAB_0030d685;
          }
        }
        in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),uVar16 < uVar9);
        lVar11 = lVar11 + 0x10;
        uVar16 = uVar16 + 1;
        pcVar19 = pcVar19 + 0x404;
      } while (uVar9 << 4 != lVar11);
      bVar22 = 0;
      pCVar18 = local_8e8;
    }
LAB_0030d685:
    paVar13 = &local_908.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var21._M_p != paVar13) {
      operator_delete(_Var21._M_p,local_908.field_2._M_allocated_capacity + 1);
    }
    paVar20 = local_8e0;
    if ((bVar22 & (byte)sVar17 & 1) != 0) {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_8c8,(pCVar18->startstr)._M_dataplus._M_p,
                           (pCVar18->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"<subject>",9);
      pcVar19 = local_8d8;
      local_908._M_dataplus._M_p = (pointer)paVar13;
      sVar17 = strlen(local_8d8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,pcVar19,pcVar19 + sVar17)
      ;
      XMLEscape(local_840,&local_908);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</subject>",10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,(pCVar18->endstr)._M_dataplus._M_p,(pCVar18->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != paVar13) {
        operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
      }
    }
    local_908._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"Title","");
    _Var21._M_p = local_908._M_dataplus._M_p;
    sVar17 = 0x3ff;
    if ((local_908._M_string_length & 0xfffffc00) == 0) {
      sVar17 = local_908._M_string_length & 0xffffffff;
    }
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_908._M_dataplus._M_p,sVar17);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar17 + 4) = 0;
    uVar9 = (ulong)paVar20->mNumProperties;
    if (uVar9 == 0) {
      bVar22 = 0;
      this = local_8e8;
    }
    else {
      pcVar19 = paVar20->mKeys->data;
      uVar15 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
      uVar16 = 1;
      lVar11 = 0;
      do {
        if (((aiString *)(pcVar19 + -4))->length == (ai_uint32)sVar17) {
          local_8d0 = CONCAT44(local_8d0._4_4_,(int)uVar15);
          iVar6 = bcmp(pcVar19,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),sVar17);
          pcVar5 = local_8d8;
          this = local_8e8;
          bVar22 = (byte)local_8d0;
          if (iVar6 == 0) {
            if (*(int *)((long)&local_8e0->mValues->mType + lVar11) == 5) {
              puVar2 = *(uint **)((long)&local_8e0->mValues->mData + lVar11);
              sVar17 = 1;
              if (puVar2 != (uint *)&local_438) {
                local_438._0_4_ = *puVar2;
                uVar9 = (ulong)(uint)local_438;
                memcpy(local_8d8,puVar2 + 1,uVar9);
                pcVar5[uVar9] = '\0';
              }
            }
            else {
              sVar17 = 0;
            }
            goto LAB_0030d8bd;
          }
        }
        uVar15 = CONCAT71((int7)((ulong)uVar15 >> 8),uVar16 < uVar9);
        lVar11 = lVar11 + 0x10;
        uVar16 = uVar16 + 1;
        pcVar19 = pcVar19 + 0x404;
      } while (uVar9 << 4 != lVar11);
      bVar22 = 0;
      this = local_8e8;
    }
LAB_0030d8bd:
    paVar13 = &local_908.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var21._M_p != paVar13) {
      operator_delete(_Var21._M_p,local_908.field_2._M_allocated_capacity + 1);
    }
    poVar10 = local_8c8;
    if ((bVar22 & (byte)sVar17 & 1) != 0) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_8c8,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<title>",7);
      pcVar19 = local_8d8;
      local_908._M_dataplus._M_p = (pointer)paVar13;
      sVar17 = strlen(local_8d8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,pcVar19,pcVar19 + sVar17)
      ;
      XMLEscape(local_840,&local_908);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</title>",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != paVar13) {
        operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
      }
    }
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar10,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<unit name=\"meter\" meter=\"",0x1a);
  poVar8 = std::ostream::_M_insert<double>((double)local_8bc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" />",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar10,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<up_axis>",9);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_8a8,(long)local_8a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</up_axis>",10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  PopTag(this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"</asset>",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  if (local_8a8 != local_898) {
    operator_delete(local_8a8,local_898[0] + 1);
  }
  return;
}

Assistant:

void ColladaExporter::WriteHeader() {
    static const ai_real epsilon = Math::getEpsilon<ai_real>();
    static const aiQuaternion x_rot(aiMatrix3x3(
        0, -1,  0,
        1,  0,  0,
        0,  0,  1));
    static const aiQuaternion y_rot(aiMatrix3x3(
        1,  0,  0,
        0,  1,  0,
        0,  0,  1));
    static const aiQuaternion z_rot(aiMatrix3x3(
        1,  0,  0,
        0,  0,  1,
        0, -1,  0));

    static const unsigned int date_nb_chars = 20;
    char date_str[date_nb_chars];
    std::time_t date = std::time(NULL);
    std::strftime(date_str, date_nb_chars, "%Y-%m-%dT%H:%M:%S", std::localtime(&date));

    aiVector3D scaling;
    aiQuaternion rotation;
    aiVector3D position;
    mScene->mRootNode->mTransformation.Decompose(scaling, rotation, position);
    rotation.Normalize();

    bool add_root_node = false;

    ai_real scale = 1.0;
    if(std::abs(scaling.x - scaling.y) <= epsilon && std::abs(scaling.x - scaling.z) <= epsilon && std::abs(scaling.y - scaling.z) <= epsilon) {
        scale = (ai_real) ((((double) scaling.x) + ((double) scaling.y) + ((double) scaling.z)) / 3.0);
    } else {
        add_root_node = true;
    }

    std::string up_axis = "Y_UP";
    if(rotation.Equal(x_rot, epsilon)) {
        up_axis = "X_UP";
    } else if(rotation.Equal(y_rot, epsilon)) {
        up_axis = "Y_UP";
    } else if(rotation.Equal(z_rot, epsilon)) {
        up_axis = "Z_UP";
    } else {
        add_root_node = true;
    }

    if(! position.Equal(aiVector3D(0, 0, 0))) {
        add_root_node = true;
    }

    if(mScene->mRootNode->mNumChildren == 0) {
        add_root_node = true;
    }

    if(add_root_node) {
        aiScene* scene;
        SceneCombiner::CopyScene(&scene, mScene);

        aiNode* root = new aiNode("Scene");

        root->mNumChildren = 1;
        root->mChildren = new aiNode*[root->mNumChildren];

        root->mChildren[0] = scene->mRootNode;
        scene->mRootNode->mParent = root;
        scene->mRootNode = root;

        mScene = scene;
        mSceneOwned = true;

        up_axis = "Y_UP";
        scale = 1.0;
    }

    mOutput << startstr << "<asset>" << endstr;
    PushTag();
    mOutput << startstr << "<contributor>" << endstr;
    PushTag();

    // If no Scene metadata, use root node metadata
    aiMetadata* meta = mScene->mMetaData;
    if (nullptr == meta) {
        meta = mScene->mRootNode->mMetaData;
    }

    aiString value;
    if (!meta || !meta->Get("Author", value)) {
        mOutput << startstr << "<author>" << "Assimp" << "</author>" << endstr;
    } else {
        mOutput << startstr << "<author>" << XMLEscape(value.C_Str()) << "</author>" << endstr;
    }

    if (nullptr == meta || !meta->Get(AI_METADATA_SOURCE_GENERATOR, value)) {
        mOutput << startstr << "<authoring_tool>" << "Assimp Exporter" << "</authoring_tool>" << endstr;
    } else {
        mOutput << startstr << "<authoring_tool>" << XMLEscape(value.C_Str()) << "</authoring_tool>" << endstr;
    }

    if (meta) {
        if (meta->Get("Comments", value)) {
            mOutput << startstr << "<comments>" << XMLEscape(value.C_Str()) << "</comments>" << endstr;
        }
        if (meta->Get(AI_METADATA_SOURCE_COPYRIGHT, value)) {
            mOutput << startstr << "<copyright>" << XMLEscape(value.C_Str()) << "</copyright>" << endstr;
        }
        if (meta->Get("SourceData", value)) {
            mOutput << startstr << "<source_data>" << XMLEscape(value.C_Str()) << "</source_data>" << endstr;
        }
    }

    PopTag();
    mOutput << startstr << "</contributor>" << endstr;

    if (nullptr == meta || !meta->Get("Created", value)) {
        mOutput << startstr << "<created>" << date_str << "</created>" << endstr;
    } else {
        mOutput << startstr << "<created>" << XMLEscape(value.C_Str()) << "</created>" << endstr;
    }

    // Modified date is always the date saved
    mOutput << startstr << "<modified>" << date_str << "</modified>" << endstr;

    if (meta) {
        if (meta->Get("Keywords", value)) {
            mOutput << startstr << "<keywords>" << XMLEscape(value.C_Str()) << "</keywords>" << endstr;
        }
        if (meta->Get("Revision", value)) {
            mOutput << startstr << "<revision>" << XMLEscape(value.C_Str()) << "</revision>" << endstr;
        }
        if (meta->Get("Subject", value)) {
            mOutput << startstr << "<subject>" << XMLEscape(value.C_Str()) << "</subject>" << endstr;
        }
        if (meta->Get("Title", value)) {
            mOutput << startstr << "<title>" << XMLEscape(value.C_Str()) << "</title>" << endstr;
        }
    }

    mOutput << startstr << "<unit name=\"meter\" meter=\"" << scale << "\" />" << endstr;
    mOutput << startstr << "<up_axis>" << up_axis << "</up_axis>" << endstr;
    PopTag();
    mOutput << startstr << "</asset>" << endstr;
}